

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyResourceState(RESOURCE_STATE States,COMMAND_QUEUE_TYPE QueueType,char *Name)

{
  String *pSVar1;
  COMMAND_QUEUE_TYPE CVar2;
  Char *pCVar3;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE Type_00;
  COMMAND_QUEUE_TYPE Type_01;
  char (*in_stack_fffffffffffffea8) [9];
  undefined1 local_128 [8];
  string msg_3;
  Char *local_e8;
  undefined1 local_e0 [8];
  string msg_2;
  Char *local_a0;
  undefined1 local_98 [8];
  string msg_1;
  String local_68;
  Char *local_48;
  undefined1 local_40 [8];
  string msg;
  RESOURCE_STATE State;
  bool Result;
  char *Name_local;
  COMMAND_QUEUE_TYPE QueueType_local;
  RESOURCE_STATE States_local;
  
  Name_local._3_1_ = QueueType;
  Name_local._4_4_ = States;
  operator&=((COMMAND_QUEUE_TYPE *)((long)&Name_local + 3),COMMAND_QUEUE_TYPE_GRAPHICS);
  msg.field_2._M_local_buf[0xf] = '\x01';
LAB_007291fa:
  if (Name_local._4_4_ == RESOURCE_STATE_UNKNOWN) {
    return (bool)(msg.field_2._M_local_buf[0xf] & 1);
  }
  msg.field_2._8_4_ =
       ExtractLSB<Diligent::RESOURCE_STATE>((RESOURCE_STATE *)((long)&Name_local + 4));
  if (msg.field_2._8_4_ == RESOURCE_STATE_UNDEFINED) goto LAB_007293a6;
  if (msg.field_2._8_4_ != RESOURCE_STATE_VERTEX_BUFFER) {
    if (msg.field_2._8_4_ == RESOURCE_STATE_CONSTANT_BUFFER) {
LAB_00729493:
      CVar2 = operator&(Name_local._3_1_,COMMAND_QUEUE_TYPE_COMPUTE);
      if ((CVar2 != COMMAND_QUEUE_TYPE_COMPUTE) &&
         (msg.field_2._M_local_buf[0xf] = '\0', Name == (char *)0x0)) {
        local_a0 = GetResourceStateFlagString(msg.field_2._8_4_);
        pSVar1 = (String *)((long)&msg_2.field_2 + 8);
        GetCommandQueueTypeString_abi_cxx11_(pSVar1,(Diligent *)(ulong)Name_local._3_1_,Type_00);
        FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
                  ((string *)local_98,(Diligent *)" contains state ",(char (*) [17])&local_a0,
                   (char **)" that is not supported in ",(char (*) [27])pSVar1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc22cf3,
                   in_stack_fffffffffffffea8);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"VerifyResourceState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x185);
        std::__cxx11::string::~string((string *)local_98);
      }
      goto LAB_007291fa;
    }
    if ((msg.field_2._8_4_ != RESOURCE_STATE_INDEX_BUFFER) &&
       (msg.field_2._8_4_ != RESOURCE_STATE_RENDER_TARGET)) {
      if (msg.field_2._8_4_ == RESOURCE_STATE_UNORDERED_ACCESS) goto LAB_00729493;
      if ((msg.field_2._8_4_ != RESOURCE_STATE_DEPTH_WRITE) &&
         (msg.field_2._8_4_ != RESOURCE_STATE_DEPTH_READ)) {
        if (msg.field_2._8_4_ == RESOURCE_STATE_SHADER_RESOURCE) goto LAB_00729493;
        if (msg.field_2._8_4_ != RESOURCE_STATE_STREAM_OUT) {
          if (msg.field_2._8_4_ == RESOURCE_STATE_INDIRECT_ARGUMENT) goto LAB_00729493;
          if ((msg.field_2._8_4_ == RESOURCE_STATE_COPY_DEST) ||
             (msg.field_2._8_4_ == RESOURCE_STATE_COPY_SOURCE)) {
LAB_007293a6:
            CVar2 = operator&(Name_local._3_1_,COMMAND_QUEUE_TYPE_TRANSFER);
            if ((CVar2 != COMMAND_QUEUE_TYPE_TRANSFER) &&
               (msg.field_2._M_local_buf[0xf] = '\0', Name == (char *)0x0)) {
              local_48 = GetResourceStateFlagString(msg.field_2._8_4_);
              GetCommandQueueTypeString_abi_cxx11_
                        (&local_68,(Diligent *)(ulong)Name_local._3_1_,Type);
              FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
                        ((string *)local_40,(Diligent *)" contains state ",(char (*) [17])&local_48,
                         (char **)" that is not supported in ",(char (*) [27])&local_68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0xc22cf3,in_stack_fffffffffffffea8);
              std::__cxx11::string::~string((string *)&local_68);
              pCVar3 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar3,"VerifyResourceState",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x177);
              std::__cxx11::string::~string((string *)local_40);
            }
            goto LAB_007291fa;
          }
          if ((msg.field_2._8_4_ != RESOURCE_STATE_RESOLVE_DEST) &&
             (((msg.field_2._8_4_ != RESOURCE_STATE_RESOLVE_SOURCE &&
               (msg.field_2._8_4_ != RESOURCE_STATE_INPUT_ATTACHMENT)) &&
              (msg.field_2._8_4_ != RESOURCE_STATE_PRESENT)))) {
            if (((msg.field_2._8_4_ == RESOURCE_STATE_BUILD_AS_READ) ||
                (msg.field_2._8_4_ == RESOURCE_STATE_BUILD_AS_WRITE)) ||
               (msg.field_2._8_4_ == RESOURCE_STATE_RAY_TRACING)) goto LAB_00729493;
            if (msg.field_2._8_4_ == RESOURCE_STATE_COMMON) goto LAB_007293a6;
            if (msg.field_2._8_4_ == RESOURCE_STATE_MAX_BIT) goto LAB_0072959b;
            FormatString<char[26]>((string *)local_128,(char (*) [26])"Unexpected resource state");
            pCVar3 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar3,"VerifyResourceState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x19c);
            std::__cxx11::string::~string((string *)local_128);
            goto LAB_007291fa;
          }
        }
      }
    }
  }
LAB_0072959b:
  CVar2 = operator&(Name_local._3_1_,COMMAND_QUEUE_TYPE_GRAPHICS);
  if ((CVar2 != COMMAND_QUEUE_TYPE_GRAPHICS) &&
     (msg.field_2._M_local_buf[0xf] = '\0', Name == (char *)0x0)) {
    local_e8 = GetResourceStateFlagString(msg.field_2._8_4_);
    pSVar1 = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_(pSVar1,(Diligent *)(ulong)Name_local._3_1_,Type_01);
    FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
              ((string *)local_e0,(Diligent *)" contains state ",(char (*) [17])&local_e8,
               (char **)" that is not supported in ",(char (*) [27])pSVar1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc22cf3,
               in_stack_fffffffffffffea8);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"VerifyResourceState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x197);
    std::__cxx11::string::~string((string *)local_e0);
  }
  goto LAB_007291fa;
}

Assistant:

bool VerifyResourceState(RESOURCE_STATE States, COMMAND_QUEUE_TYPE QueueType, const char* Name)
{
    QueueType &= COMMAND_QUEUE_TYPE_PRIMARY_MASK;

    bool Result = true;
    while (States != 0)
    {
        RESOURCE_STATE State = ExtractLSB(States);

        static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "Please update the switch below to handle the new resource state");
        switch (State)
        {
            case RESOURCE_STATE_UNDEFINED:
            case RESOURCE_STATE_COPY_DEST:
            case RESOURCE_STATE_COPY_SOURCE:
            case RESOURCE_STATE_COMMON:
                if ((QueueType & COMMAND_QUEUE_TYPE_TRANSFER) != COMMAND_QUEUE_TYPE_TRANSFER)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            case RESOURCE_STATE_CONSTANT_BUFFER:
            case RESOURCE_STATE_UNORDERED_ACCESS:
            case RESOURCE_STATE_SHADER_RESOURCE:
            case RESOURCE_STATE_INDIRECT_ARGUMENT:
            case RESOURCE_STATE_BUILD_AS_READ:
            case RESOURCE_STATE_BUILD_AS_WRITE:
            case RESOURCE_STATE_RAY_TRACING:
                if ((QueueType & COMMAND_QUEUE_TYPE_COMPUTE) != COMMAND_QUEUE_TYPE_COMPUTE)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            case RESOURCE_STATE_VERTEX_BUFFER:
            case RESOURCE_STATE_INDEX_BUFFER:
            case RESOURCE_STATE_RENDER_TARGET:
            case RESOURCE_STATE_DEPTH_WRITE:
            case RESOURCE_STATE_DEPTH_READ:
            case RESOURCE_STATE_STREAM_OUT:
            case RESOURCE_STATE_RESOLVE_DEST:
            case RESOURCE_STATE_RESOLVE_SOURCE:
            case RESOURCE_STATE_INPUT_ATTACHMENT:
            case RESOURCE_STATE_PRESENT:
            case RESOURCE_STATE_SHADING_RATE:
                if ((QueueType & COMMAND_QUEUE_TYPE_GRAPHICS) != COMMAND_QUEUE_TYPE_GRAPHICS)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            default:
                UNEXPECTED("Unexpected resource state");
                break;
        }
    }
    return Result;
}